

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::RendererTests_renderHoveredButtons_Test::
~RendererTests_renderHoveredButtons_Test(RendererTests_renderHoveredButtons_Test *this)

{
  GraphicsSystemMock *pGVar1;
  
  (this->super_RendererTests).super_Test._vptr_Test = (_func_int **)&PTR__RendererTests_00325b68;
  if (((this->super_RendererTests).graphicsSystemMock.isUniquePointerCreated == false) &&
     (pGVar1 = (this->super_RendererTests).graphicsSystemMock.rawPointer,
     pGVar1 != (GraphicsSystemMock *)0x0)) {
    (*(pGVar1->super_GraphicsSystem)._vptr_GraphicsSystem[1])();
  }
  (this->super_RendererTests).buttonMock.super_Button._vptr_Button =
       (_func_int **)&PTR__ButtonMock_0031a268;
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker
            (&(this->super_RendererTests).buttonMock.gmock10_isHovered_12);
  testing::internal::FunctionMocker<bool_(const_solitaire::geometry::Position_&)>::~FunctionMocker
            (&(this->super_RendererTests).buttonMock.gmock11_collidesWith_11);
  testing::internal::FunctionMocker<void_(bool)>::~FunctionMocker
            (&(this->super_RendererTests).buttonMock.gmock01_setHoveredState_10);
  SolitaireMock::~SolitaireMock(&(this->super_RendererTests).solitaireMock);
  ContextMock::~ContextMock(&(this->super_RendererTests).contextMock);
  testing::InSequence::~InSequence(&(this->super_RendererTests).seq);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x9d0);
  return;
}

Assistant:

TEST_F(RendererTests, renderHoveredButtons) {
    EXPECT_CALL(*graphicsSystemMock,
        renderTextureInFullWindow(backgroundTextureId));
    EXPECT_CALL(contextMock, getNewGameButton()).WillOnce(ReturnRef(buttonMock));
    EXPECT_CALL(buttonMock, isHovered()).WillOnce(Return(true));
    EXPECT_CALL(*graphicsSystemMock, setTextureAlpha(newGameId, noAlpha));
    EXPECT_CALL(contextMock, getUndoButton()).WillOnce(ReturnRef(buttonMock));
    EXPECT_CALL(buttonMock, isHovered()).WillOnce(Return(true));
    EXPECT_CALL(*graphicsSystemMock, setTextureAlpha(undoId, noAlpha));
    expectRenderButtons();
    EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
    EXPECT_CALL(solitaireMock, isGameFinished()).WillOnce(Return(true));
    EXPECT_CALL(*graphicsSystemMock, renderTextureInFullWindow(winId));
    EXPECT_CALL(*graphicsSystemMock, renderFrame());

    Renderer {contextMock, graphicsSystemMock.make_unique(), assetsPath}.render();
}